

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.cpp
# Opt level: O3

JumpAnnotation * __thiscall asmjit::_abi_1_10::BaseCompiler::newJumpAnnotation(BaseCompiler *this)

{
  size_type *psVar1;
  uint32_t uVar2;
  uint uVar3;
  Error EVar4;
  JumpAnnotation *pJVar5;
  undefined4 extraout_var;
  CodeHolder *code;
  BaseBuilder *this_00;
  BaseBuilder *allocator;
  uint uStack_44;
  size_t local_20;
  
  this_00 = (BaseBuilder *)&this->_jumpAnnotations;
  allocator = (BaseBuilder *)&(this->super_BaseBuilder)._allocator;
  code = (CodeHolder *)allocator;
  EVar4 = ZoneVectorBase::_grow((ZoneVectorBase *)this_00,(ZoneAllocator *)allocator,8,1);
  if (EVar4 != 0) {
LAB_0011a99f:
    BaseEmitter::reportError((BaseEmitter *)this,1,(char *)0x0);
    return (JumpAnnotation *)0x0;
  }
  if ((this->super_BaseBuilder)._allocator._zone == (Zone *)0x0) {
    newJumpAnnotation();
  }
  else {
    uVar2 = (this->_jumpAnnotations).super_ZoneVectorBase._size;
    code = (CodeHolder *)0x20;
    pJVar5 = (JumpAnnotation *)ZoneAllocator::_alloc((ZoneAllocator *)allocator,0x20,&local_20);
    if (pJVar5 == (JumpAnnotation *)0x0) goto LAB_0011a99f;
    pJVar5->_compiler = this;
    pJVar5->_annotationId = uVar2;
    (pJVar5->_labelIds).super_ZoneVectorBase._data = (void *)0x0;
    (pJVar5->_labelIds).super_ZoneVectorBase._size = 0;
    (pJVar5->_labelIds).super_ZoneVectorBase._capacity = 0;
    uVar3 = (this->_jumpAnnotations).super_ZoneVectorBase._size;
    this_00 = allocator;
    if (uVar3 < (this->_jumpAnnotations).super_ZoneVectorBase._capacity) {
      *(JumpAnnotation **)
       ((long)(this->_jumpAnnotations).super_ZoneVectorBase._data + (ulong)uVar3 * 8) = pJVar5;
      psVar1 = &(this->_jumpAnnotations).super_ZoneVectorBase._size;
      *psVar1 = *psVar1 + 1;
      return pJVar5;
    }
  }
  newJumpAnnotation();
  EVar4 = BaseBuilder::onAttach(this_00,code);
  pJVar5 = (JumpAnnotation *)CONCAT44(extraout_var,EVar4);
  if (EVar4 == 0) {
    onAttach();
    pJVar5 = (JumpAnnotation *)(ulong)uStack_44;
  }
  return pJVar5;
}

Assistant:

JumpAnnotation* BaseCompiler::newJumpAnnotation() {
  if (_jumpAnnotations.grow(&_allocator, 1) != kErrorOk) {
    reportError(DebugUtils::errored(kErrorOutOfMemory));
    return nullptr;
  }

  uint32_t id = _jumpAnnotations.size();
  JumpAnnotation* jumpAnnotation = _allocator.newT<JumpAnnotation>(this, id);

  if (!jumpAnnotation) {
    reportError(DebugUtils::errored(kErrorOutOfMemory));
    return nullptr;
  }

  _jumpAnnotations.appendUnsafe(jumpAnnotation);
  return jumpAnnotation;
}